

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

bool __thiscall argo::json::number_equal(json *this,json *other)

{
  json_exception *this_00;
  
  if ((other->m_raw_value)._M_string_length != 0 || (this->m_raw_value)._M_string_length != 0) {
    this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
    json_exception::json_exception(this_00,cant_compare_raw_e);
    __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
  }
  if (this->m_type == number_int_e) {
    return (this->m_value).u_number_int == (other->m_value).u_number_int;
  }
  return (bool)(-((other->m_value).u_number_double == (this->m_value).u_number_double) & 1);
}

Assistant:

bool json::number_equal(const json &other) const
{
    if (m_raw_value.size() == 0 && other.m_raw_value.size() == 0)
    {
        if (m_type == number_int_e)
        {
            return m_value.u_number_int == other.m_value.u_number_int;
        }
        else
        {
            // Will only work if they are exactly the same in all bits.
            return m_value.u_number_double == other.m_value.u_number_double;
        }
    }
    else
    {
        throw json_exception(json_exception::cant_compare_raw_e);
    }
}